

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

void mpr_add_addr_node_to_set(avl_tree *set,netaddr addr,uint32_t offset)

{
  avl_node *paVar1;
  uint8_t *puVar2;
  
  paVar1 = avl_find(set,&addr);
  if (paVar1 == (avl_node *)0x0) {
    puVar2 = (uint8_t *)calloc(1,0x58);
    *(undefined8 *)puVar2 = addr._addr._0_8_;
    *(undefined8 *)(puVar2 + 8) = addr._addr._8_8_;
    puVar2[0x10] = addr._type;
    puVar2[0x11] = addr._prefix_len;
    *(uint8_t **)(puVar2 + 0x40) = puVar2;
    *(uint32_t *)(puVar2 + 0x50) = offset;
    avl_insert(set,(avl_node *)(puVar2 + 0x18));
  }
  return;
}

Assistant:

void
mpr_add_addr_node_to_set(struct avl_tree *set, const struct netaddr addr, uint32_t offset) {
  struct addr_node *tmp_node;

  tmp_node = avl_find_element(set, &addr, tmp_node, _avl_node);
  if (tmp_node) {
    return;
  }
  tmp_node = calloc(1, sizeof(struct addr_node));
  tmp_node->addr = addr;
  tmp_node->_avl_node.key = &tmp_node->addr;
  tmp_node->table_offset = offset;
  avl_insert(set, &tmp_node->_avl_node);
}